

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O1

CppType __thiscall google::protobuf::MapValueRef::type(MapValueRef *this)

{
  LogMessage *pLVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  if ((this->type_ == 0) || (this->data_ == (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x2a0);
    pLVar1 = internal::LogMessage::operator<<(&local_48,"Protocol Buffer map usage error:\n");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"MapValueRef::type MapValueRef is not initialized.");
    internal::LogFinisher::operator=(&local_49,pLVar1);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return this->type_;
}

Assistant:

FieldDescriptor::CppType type() const {
    if (type_ == 0 || data_ == NULL) {
      GOOGLE_LOG(FATAL) << "Protocol Buffer map usage error:\n"
                 << "MapValueRef::type MapValueRef is not initialized.";
    }
    return (FieldDescriptor::CppType)type_;
  }